

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_power_udev.c
# Opt level: O2

int gsc_set_device_power_control(char *devpath,uint8_t power_control)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  igsc_log_func_t p_Var7;
  char *pcVar8;
  undefined8 uVar9;
  undefined7 in_register_00000031;
  char *pcVar10;
  long in_FS_OFFSET;
  undefined8 uStackY_170;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar11;
  char __time_buf_2 [128];
  stat st;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (int)CONCAT71(in_register_00000031,power_control);
  if (iVar2 == 1) {
    pcVar10 = "on";
  }
  else {
    if (iVar2 != 2) {
      p_Var7 = igsc_get_log_callback_func();
      if (p_Var7 == (igsc_log_func_t)0x0) {
        pcVar10 = gsc_time((char *)&st,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar10,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x66,CONCAT44(uVar11,iVar2));
      }
      else {
        p_Var7 = igsc_get_log_callback_func();
        pcVar10 = gsc_time((char *)&st,0x80);
        (*p_Var7)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Wrong power control %u\n",pcVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x66,CONCAT44(uVar11,iVar2));
      }
      iVar2 = 1;
      goto LAB_0011d9d2;
    }
    pcVar10 = "auto";
  }
  lVar4 = udev_new();
  if (lVar4 == 0) {
    p_Var7 = igsc_get_log_callback_func();
    if (p_Var7 == (igsc_log_func_t)0x0) {
      pcVar10 = gsc_time((char *)&st,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar10,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
             ,"gsc_set_device_power_control",0x6d);
    }
    else {
      p_Var7 = igsc_get_log_callback_func();
      pcVar10 = gsc_time((char *)&st,0x80);
      (*p_Var7)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Cannot create udev\n",pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                ,"gsc_set_device_power_control",0x6d);
    }
    iVar2 = 2;
    goto LAB_0011d9d2;
  }
  iVar2 = lstat(devpath,(stat *)&st);
  if (iVar2 < 0) {
    p_Var7 = igsc_get_log_callback_func();
    if (p_Var7 != (igsc_log_func_t)0x0) {
      p_Var7 = igsc_get_log_callback_func();
      pcVar10 = gsc_time(__time_buf_2,0x80);
      pcVar8 = "%s: IGSC: (%s:%s():%d) Cannot lstat %s\n";
      uStackY_170 = 0x73;
      goto LAB_0011d847;
    }
    pcVar10 = gsc_time(__time_buf_2,0x80);
    pcVar8 = "%s: IGSC: (%s:%s():%d) Cannot lstat %s\n";
    uStackY_170 = 0x73;
LAB_0011d9b3:
    lVar5 = 0;
LAB_0011d9b8:
    syslog(3,pcVar8,pcVar10,
           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
           ,"gsc_set_device_power_control",uStackY_170,devpath);
LAB_0011d9bf:
    iVar2 = 1;
  }
  else {
    lVar5 = udev_device_new_from_devnum(lVar4,99,st.st_rdev);
    if (lVar5 == 0) {
      p_Var7 = igsc_get_log_callback_func();
      if (p_Var7 == (igsc_log_func_t)0x0) {
        pcVar10 = gsc_time(__time_buf_2,0x80);
        pcVar8 = "%s: IGSC: (%s:%s():%d) Cannot create device for %s\n";
        uStackY_170 = 0x7b;
        goto LAB_0011d9b3;
      }
      p_Var7 = igsc_get_log_callback_func();
      pcVar10 = gsc_time(__time_buf_2,0x80);
      pcVar8 = "%s: IGSC: (%s:%s():%d) Cannot create device for %s\n";
      uStackY_170 = 0x7b;
LAB_0011d847:
      lVar5 = 0;
LAB_0011d84e:
      (*p_Var7)(IGSC_LOG_LEVEL_ERROR,pcVar8,pcVar10,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                ,"gsc_set_device_power_control",uStackY_170,devpath);
      goto LAB_0011d9bf;
    }
    lVar6 = udev_device_get_parent_with_subsystem_devtype(lVar5,"pci",0);
    if (lVar6 == 0) {
      p_Var7 = igsc_get_log_callback_func();
      if (p_Var7 == (igsc_log_func_t)0x0) {
        pcVar10 = gsc_time(__time_buf_2,0x80);
        devpath = (char *)udev_device_get_sysname(lVar5);
        pcVar8 = "%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n";
        uStackY_170 = 0x84;
        goto LAB_0011d9b8;
      }
      p_Var7 = igsc_get_log_callback_func();
      pcVar10 = gsc_time(__time_buf_2,0x80);
      devpath = (char *)udev_device_get_sysname();
      pcVar8 = "%s: IGSC: (%s:%s():%d) Can\'t find device parent for \'%s\'\n";
      uStackY_170 = 0x84;
      goto LAB_0011d84e;
    }
    iVar2 = udev_device_set_sysattr_value(lVar6,"power/control",pcVar10);
    if (iVar2 < 0) {
      p_Var7 = igsc_get_log_callback_func();
      if (p_Var7 == (igsc_log_func_t)0x0) {
        pcVar10 = gsc_time(__time_buf_2,0x80);
        devpath = (char *)udev_device_get_sysname(lVar6);
        pcVar8 = "%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n";
        uStackY_170 = 0x8c;
        goto LAB_0011d9b8;
      }
      p_Var7 = igsc_get_log_callback_func();
      pcVar10 = gsc_time(__time_buf_2,0x80);
      devpath = (char *)udev_device_get_sysname();
      pcVar8 = "%s: IGSC: (%s:%s():%d) failed to set power/control on %s %d\n";
      uStackY_170 = 0x8c;
      goto LAB_0011d84e;
    }
    uVar3 = igsc_get_log_level();
    if (uVar3 != 0) {
      p_Var7 = igsc_get_log_callback_func();
      if (p_Var7 == (igsc_log_func_t)0x0) {
        pcVar8 = gsc_time(__time_buf_2,0x80);
        uVar9 = udev_device_get_sysname(lVar6);
        syslog(7,"%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",pcVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
               ,"gsc_set_device_power_control",0x90,pcVar10,uVar9);
      }
      else {
        p_Var7 = igsc_get_log_callback_func();
        pcVar8 = gsc_time(__time_buf_2,0x80);
        uVar9 = udev_device_get_sysname(lVar6);
        (*p_Var7)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) power/control is set to %s on %s\n",
                  pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/power/igsc_power_udev.c"
                  ,"gsc_set_device_power_control",0x90,pcVar10,uVar9);
      }
    }
  }
  udev_device_unref(lVar5);
  udev_unref(lVar4);
LAB_0011d9d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int gsc_set_device_power_control(const char *devpath, uint8_t power_control)
{
    struct udev *udev = NULL;
    struct udev_device *dev = NULL;
    struct udev_device *parent;
    struct stat st;
    const char *val;
    int ret;

    switch (power_control)
    {
    case GSC_POWER_CONTROL_ON:
        val = "on";
        break;
    case GSC_POWER_CONTROL_AUTO:
        val = "auto";
        break;
    default:
        gsc_error("Wrong power control %u\n", power_control);
        return IGSC_ERROR_INTERNAL;
    }

    udev = udev_new();
    if (udev == NULL)
    {
        gsc_error("Cannot create udev\n");
        return IGSC_ERROR_NOMEM;
    }

    if (lstat(devpath, &st) < 0)
    {
        gsc_error("Cannot lstat %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    dev = udev_device_new_from_devnum(udev, 'c', st.st_rdev);
    if (dev == NULL)
    {
        gsc_error("Cannot create device for %s\n", devpath);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    /* Look for the GFX PCI parent */
    parent = udev_device_get_parent_with_subsystem_devtype(dev, "pci", NULL);
    if (parent == NULL)
    {
        gsc_error("Can't find device parent for '%s'\n", udev_device_get_sysname(dev));
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }

    ret = udev_device_set_sysattr_value(parent, "power/control", (char *)val);
    if (ret < 0)
    {
        gsc_error("failed to set power/control on %s %d\n", udev_device_get_sysname(parent), ret);
        ret = IGSC_ERROR_INTERNAL;
        goto out;
    }
    gsc_debug("power/control is set to %s on %s\n", val, udev_device_get_sysname(parent));

out:
    udev_device_unref(dev);
    udev_unref(udev);
    return ret;
}